

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::correctOutput(HlslParseContext *this,TQualifier *qualifier)

{
  ulong uVar1;
  ulong uVar2;
  TIntermediate *pTVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = *(ulong *)&qualifier->field_0x8;
  uVar2 = *(ulong *)&qualifier->field_0x24;
  *(ulong *)&qualifier->field_0x8 = uVar1 & 0x1fffffffffffffff;
  qualifier->field_0x10 = qualifier->field_0x10 & 0xf0;
  qualifier->layoutOffset = -1;
  qualifier->layoutAlign = -1;
  uVar6 = *(ulong *)&qualifier->field_0x1c & 0xffff0000ffc07fff;
  *(ulong *)&qualifier->field_0x1c = uVar6 | 0xffff001f8000;
  *(ulong *)&qualifier->field_0x24 = uVar2 | 0xff00000000;
  qualifier->layoutPushConstant = false;
  if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
    *(ulong *)&qualifier->field_0x8 = uVar1 & 0x1fffc01f1fffffff;
  }
  if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangGeometry) {
    *(ulong *)&qualifier->field_0x1c = uVar6 | 0xff00ffff001f8000;
  }
  if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
    *(ulong *)&qualifier->field_0x24 = uVar2 | 0xff7fffffff;
  }
  if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangTessControl) {
    qualifier->field_0xd = qualifier->field_0xd & 0xef;
  }
  uVar1 = *(ulong *)&qualifier->field_0x8;
  if ((uVar1 & 0xff80) == 0) {
    *(ulong *)&qualifier->field_0x8 = (uint)(uVar1 >> 9) & 0xff80 | uVar1;
  }
  uVar5 = *(uint *)&qualifier->field_0x8 >> 7 & 0x1ff;
  if (uVar5 == 0x92) {
    pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar3->depthReplacing = true;
    if (pTVar3->depthLayout == EldNone) {
      pTVar3->depthLayout = EldLess;
    }
  }
  else {
    if (uVar5 != 0x91) {
      if (uVar5 == 0x43) {
        pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar3->depthReplacing = true;
        if (pTVar3->depthLayout == EldNone) {
          pTVar3->depthLayout = EldAny;
        }
      }
      goto LAB_0041ea11;
    }
    pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar3->depthReplacing = true;
    if (pTVar3->depthLayout == EldNone) {
      pTVar3->depthLayout = EldGreater;
    }
  }
  *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffff007f | 0x2180;
LAB_0041ea11:
  bVar4 = isOutputBuiltIn(this,qualifier);
  if (!bVar4) {
    *(ushort *)&qualifier->field_0x8 = *(ushort *)&qualifier->field_0x8 & 0x7f;
  }
  return;
}

Assistant:

void HlslParseContext::correctOutput(TQualifier& qualifier)
{
    clearUniform(qualifier);
    if (language == EShLangFragment)
        qualifier.clearInterstage();
    if (language != EShLangGeometry)
        qualifier.clearStreamLayout();
    if (language == EShLangFragment)
        qualifier.clearXfbLayout();
    if (language != EShLangTessControl)
        qualifier.patch = false;

    // Fixes Test/hlsl.entry-inout.vert (SV_Position will not become a varying).
    if (qualifier.builtIn == EbvNone)
        qualifier.builtIn = qualifier.declaredBuiltIn;

    switch (qualifier.builtIn) {
    case EbvFragDepth:
        intermediate.setDepthReplacing();
        intermediate.setDepth(EldAny);
        break;
    case EbvFragDepthGreater:
        intermediate.setDepthReplacing();
        intermediate.setDepth(EldGreater);
        qualifier.builtIn = EbvFragDepth;
        break;
    case EbvFragDepthLesser:
        intermediate.setDepthReplacing();
        intermediate.setDepth(EldLess);
        qualifier.builtIn = EbvFragDepth;
        break;
    default:
        break;
    }

    if (! isOutputBuiltIn(qualifier))
        qualifier.builtIn = EbvNone;
}